

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAxisAngularAccelerometerSensor.cpp
# Opt level: O0

void __thiscall
iDynTree::ThreeAxisAngularAccelerometerSensor::ThreeAxisAngularAccelerometerSensor
          (ThreeAxisAngularAccelerometerSensor *this,ThreeAxisAngularAccelerometerSensor *other)

{
  void *pvVar1;
  ThreeAxisAngularAccelerometerPrivateAttributes *in_RSI;
  undefined8 *in_RDI;
  LinkSensor *in_stack_ffffffffffffffd0;
  undefined8 *puVar2;
  ThreeAxisAngularAccelerometerPrivateAttributes *in_stack_ffffffffffffffe8;
  
  LinkSensor::LinkSensor(in_stack_ffffffffffffffd0);
  *in_RDI = &PTR__ThreeAxisAngularAccelerometerSensor_004faa78;
  puVar2 = in_RDI + 1;
  pvVar1 = operator_new(0xa8);
  ThreeAxisAngularAccelerometerPrivateAttributes::ThreeAxisAngularAccelerometerPrivateAttributes
            (in_RSI,in_stack_ffffffffffffffe8);
  *puVar2 = pvVar1;
  return;
}

Assistant:

ThreeAxisAngularAccelerometerSensor::ThreeAxisAngularAccelerometerSensor(const ThreeAxisAngularAccelerometerSensor& other):
    pimpl(new ThreeAxisAngularAccelerometerPrivateAttributes(*(other.pimpl)))
{

}